

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo * __thiscall
ByteCodeGenerator::StartBindGlobalStatements(ByteCodeGenerator *this,ParseNodeProg *pnode)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  FuncInfo *this_00;
  int32 currentAstSize;
  TrackAllocData local_50;
  FuncInfo *local_28;
  FuncInfo *funcInfo;
  FunctionBody *byteCodeFunction;
  ParseNodeProg *pnode_local;
  ByteCodeGenerator *this_local;
  
  byteCodeFunction = (FunctionBody *)pnode;
  pnode_local = (ParseNodeProg *)this;
  if (this->parentScopeInfo == (ScopeInfo *)0x0) {
    this->currentScope = (pnode->super_ParseNodeFnc).scope;
    if (this->currentScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x464,"(currentScope)","currentScope");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this->globalScope = this->currentScope;
  }
  else {
    this->trackEnvDepth = true;
    RestoreScopeInfo(this,this->parentScopeInfo,(FuncInfo *)0x0);
    this->trackEnvDepth = false;
  }
  bVar3 = IsInNonDebugMode(this);
  if ((((bVar3) || (this->pCurrentFunction == (FunctionBody *)0x0)) ||
      (bVar3 = Js::ParseableFunctionInfo::GetIsGlobalFunc
                         (&this->pCurrentFunction->super_ParseableFunctionInfo), !bVar3)) ||
     (bVar3 = Js::ParseableFunctionInfo::IsFakeGlobalFunc
                        (&this->pCurrentFunction->super_ParseableFunctionInfo,this->flags), bVar3))
  {
    if ((this->flags & 0x800000) == 0) {
      funcInfo = (FuncInfo *)MakeGlobalFunctionBody(this,(ParseNode *)byteCodeFunction);
      Js::FunctionProxy::SetIsTopLevel((FunctionProxy *)funcInfo,true);
      bVar3 = ParseNodeFnc::GetStrictMode((ParseNodeFnc *)byteCodeFunction);
      if (bVar3) {
        Js::ParseableFunctionInfo::SetIsStrictMode((ParseableFunctionInfo *)funcInfo);
      }
    }
    else {
      funcInfo = (FuncInfo *)EnsureFakeGlobalFuncForUndefer(this,(ParseNode *)byteCodeFunction);
    }
  }
  else {
    funcInfo = (FuncInfo *)this->pCurrentFunction;
    Js::FunctionBody::RemoveDeferParseAttribute((FunctionBody *)funcInfo);
    Js::FunctionBody::ResetByteCodeGenVisitState((FunctionBody *)funcInfo);
  }
  bVar3 = Js::ParseableFunctionInfo::IsReparsed((ParseableFunctionInfo *)funcInfo);
  if (bVar3) {
    Js::FunctionBody::RestoreState((FunctionBody *)funcInfo,(ParseNodeFnc *)byteCodeFunction);
  }
  else {
    Js::FunctionBody::SaveState((FunctionBody *)funcInfo,(ParseNodeFnc *)byteCodeFunction);
  }
  pAVar5 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&FuncInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
             ,0x48b);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_50);
  this_00 = (FuncInfo *)new<Memory::ArenaAllocator>(0x300,(ArenaAllocator *)pAVar5,0x3f67b0);
  FuncInfo::FuncInfo(this_00,L"glo",this->alloc,this,(Scope *)0x0,this->globalScope,
                     (ParseNodeFnc *)byteCodeFunction,(ParseableFunctionInfo *)funcInfo);
  iVar1 = *(int *)((long)&(byteCodeFunction->super_ParseableFunctionInfo).
                          crossSiteUndeferredFunctionType.ptr + 4);
  if (this->maxAstSize < iVar1) {
    this->maxAstSize = iVar1;
  }
  local_28 = this_00;
  PushFuncInfo(this,L"StartBindGlobalStatements",this_00);
  return local_28;
}

Assistant:

FuncInfo * ByteCodeGenerator::StartBindGlobalStatements(ParseNodeProg *pnode)
{
    if (parentScopeInfo)
    {
        trackEnvDepth = true;
        RestoreScopeInfo(parentScopeInfo, nullptr);
        trackEnvDepth = false;
        // "currentScope" is the parentFunc scope. This ensures the deferred func declaration
        // symbol will bind to the func declaration symbol already available in parentFunc scope.
    }
    else
    {
        currentScope = pnode->scope;
        Assert(currentScope);
        globalScope = currentScope;
    }

    Js::FunctionBody * byteCodeFunction;

    if (!IsInNonDebugMode() && this->pCurrentFunction != nullptr && this->pCurrentFunction->GetIsGlobalFunc() && !this->pCurrentFunction->IsFakeGlobalFunc(flags))
    {
        // we will re-use the global FunctionBody which was created before deferred parse.
        byteCodeFunction = this->pCurrentFunction;
        byteCodeFunction->RemoveDeferParseAttribute();
        byteCodeFunction->ResetByteCodeGenVisitState();
    }
    else if ((this->flags & fscrDeferredFnc))
    {
        byteCodeFunction = this->EnsureFakeGlobalFuncForUndefer(pnode);
    }
    else
    {
        byteCodeFunction = this->MakeGlobalFunctionBody(pnode);

        // Mark this global function to required for register script event
        byteCodeFunction->SetIsTopLevel(true);

        if (pnode->GetStrictMode() != 0)
        {
            byteCodeFunction->SetIsStrictMode();
        }
    }
    if (byteCodeFunction->IsReparsed())
    {
        byteCodeFunction->RestoreState(pnode);
    }
    else
    {
        byteCodeFunction->SaveState(pnode);
    }

    FuncInfo *funcInfo = Anew(alloc, FuncInfo, Js::Constants::GlobalFunction,
        alloc, this, nullptr, globalScope, pnode, byteCodeFunction);

    int32 currentAstSize = pnode->astSize;
    if (currentAstSize > this->maxAstSize)
    {
        this->maxAstSize = currentAstSize;
    }
    PushFuncInfo(_u("StartBindGlobalStatements"), funcInfo);

    return funcInfo;
}